

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# values.h
# Opt level: O3

void mpt::apply<mpt::point<double>,double>
               (point<double> *d,linepart *pt,double *src,point<double> *scale)

{
  ulong uVar1;
  point<double> pVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double *pdVar6;
  ulong uVar7;
  ulong uVar8;
  float fVar9;
  double dVar10;
  
  uVar7 = (ulong)pt->usr;
  dVar4 = scale->x;
  dVar5 = scale->y;
  fVar9 = linepart::cut(pt);
  if ((fVar9 != 0.0) || (NAN(fVar9))) {
    if (pt->raw < 2) {
      return;
    }
    dVar10 = (src[1] - *src) * (double)fVar9 + *src;
    d->x = dVar10 * dVar4 + d->x;
    d->y = dVar10 * dVar5 + d->y;
    uVar8 = 1;
  }
  else {
    uVar8 = 0;
  }
  fVar9 = linepart::trim(pt);
  if ((fVar9 != 0.0) || (NAN(fVar9))) {
    if (pt->raw < 2) {
      return;
    }
    uVar1 = uVar7 - 1;
    dVar10 = (src[uVar7 - 2] - src[uVar7 - 1]) * (double)fVar9 + src[uVar7 - 1];
    dVar3 = dVar10 * dVar5 + d[uVar1].y;
    pVar2.y._0_4_ = SUB84(dVar3,0);
    pVar2.x = dVar10 * dVar4 + d[uVar1].x;
    pVar2.y._4_4_ = (int)((ulong)dVar3 >> 0x20);
    d[uVar1] = pVar2;
    uVar7 = uVar1;
  }
  if (uVar8 < uVar7) {
    pdVar6 = (double *)((long)&d->y + (ulong)(uint)((int)uVar8 << 4));
    do {
      pdVar6[-1] = src[uVar8] * dVar4 + pdVar6[-1];
      *pdVar6 = src[uVar8] * dVar5 + *pdVar6;
      uVar8 = uVar8 + 1;
      pdVar6 = pdVar6 + 2;
    } while (uVar7 != uVar8);
  }
  return;
}

Assistant:

void apply(T *d, const linepart &pt, const S *src, const T &scale)
{
	size_t j = 0, len = pt.usr;
	S sx(scale.x), sy(scale.y), part;
	
	if ((part = pt.cut())) {
		if (pt.raw < 2) {
			return;
		}
		++j;
		S s1 = src[0];
		S s2 = src[1];
		part = s1 + part * (s2 - s1);
		
		d->x += sx * part;
		d->y += sy * part;
	}
	if ((part = pt.trim())) {
		if (pt.raw < 2) {
			return;
		}
		--len;
		S s1 = src[len - 1];
		S s2 = src[len];
		part = s2 + part * (s1 - s2);
		
		d[len].x += sx * part;
		d[len].y += sy * part;
	}
	for ( ; j < len ; j++ ) {
		d[j].x += sx * src[j];
		d[j].y += sy * src[j];
	}
}